

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vpm.c
# Opt level: O0

int X509_VERIFY_PARAM_set1_ip_asc(X509_VERIFY_PARAM *param,char *ipasc)

{
  int iVar1;
  size_t iplen;
  uchar ipout [16];
  uchar *in_stack_ffffffffffffffc8;
  X509_VERIFY_PARAM *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  iVar1 = ossl_a2i_ipadd(in_stack_ffffffffffffffc8,(char *)0x2d935d);
  if ((uchar *)(long)iVar1 == (uchar *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = X509_VERIFY_PARAM_set1_ip
                        (in_stack_ffffffffffffffd8,(uchar *)(long)iVar1,
                         (size_t)in_stack_ffffffffffffffc8);
  }
  return local_4;
}

Assistant:

int X509_VERIFY_PARAM_set1_ip_asc(X509_VERIFY_PARAM *param, const char *ipasc)
{
    unsigned char ipout[16];
    size_t iplen;

    iplen = (size_t)ossl_a2i_ipadd(ipout, ipasc);
    if (iplen == 0)
        return 0;
    return X509_VERIFY_PARAM_set1_ip(param, ipout, iplen);
}